

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O3

void __thiscall HighsCliqueTable::removeClique(HighsCliqueTable *this,HighsInt cliqueid)

{
  uint uVar1;
  CliqueVar CVar2;
  CliqueVar CVar3;
  iterator iVar4;
  pointer pCVar5;
  pointer pCVar6;
  KeyType KVar7;
  HighsInt i;
  uint uVar8;
  HighsInt len;
  HighsInt start;
  HighsInt local_34;
  int local_30;
  uint local_2c;
  KeyType local_28;
  
  pCVar6 = (this->cliques).
           super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_34 = cliqueid;
  if ((pCVar6[cliqueid].origin | 0x80000000U) != 0xffffffff) {
    iVar4._M_current =
         (this->deletedrows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (this->deletedrows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->deletedrows,iVar4,
                 &pCVar6[cliqueid].origin);
      pCVar6 = (this->cliques).
               super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      *iVar4._M_current = pCVar6[cliqueid].origin;
      (this->deletedrows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
  }
  uVar8 = pCVar6[cliqueid].start;
  uVar1 = pCVar6[cliqueid].end;
  local_30 = uVar1 - uVar8;
  local_2c = uVar8;
  if (local_30 == 2) {
    pCVar5 = (this->cliqueentries).
             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             ._M_impl.super__Vector_impl_data._M_start;
    CVar2 = pCVar5[(int)uVar8];
    CVar3 = pCVar5[(long)(int)uVar8 + 1];
    KVar7.second = CVar2;
    KVar7.first = CVar3;
    local_28 = (KeyType)((long)KVar7 << 0x20 | (ulong)(uint)CVar2);
    if (((uint)CVar3 & 0x7fffffff) < ((uint)CVar2 & 0x7fffffff)) {
      local_28 = KVar7;
    }
    HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::erase
              (&this->sizeTwoCliques,&local_28);
  }
  for (; uVar1 != uVar8; uVar8 = uVar8 + 1) {
    unlink(this,(char *)(ulong)uVar8);
  }
  iVar4._M_current =
       (this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->freeslots,iVar4,&local_34);
  }
  else {
    *iVar4._M_current = cliqueid;
    (this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar4._M_current + 1;
  }
  std::
  _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
  ::_M_emplace_unique<int&,int&>
            ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
              *)&this->freespaces,&local_30,(int *)&local_2c);
  pCVar6 = (this->cliques).
           super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pCVar6[local_34].start = -1;
  pCVar6[local_34].end = -1;
  this->numEntries = this->numEntries - local_30;
  return;
}

Assistant:

void HighsCliqueTable::removeClique(HighsInt cliqueid) {
  if (cliques[cliqueid].origin != kHighsIInf && cliques[cliqueid].origin != -1)
    deletedrows.push_back(cliques[cliqueid].origin);

  HighsInt start = cliques[cliqueid].start;
  assert(start != -1);
  HighsInt end = cliques[cliqueid].end;
  HighsInt len = end - start;
  if (len == 2) {
    sizeTwoCliques.erase(
        sortedEdge(cliqueentries[start], cliqueentries[start + 1]));
  }

  for (HighsInt i = start; i != end; ++i) {
    unlink(i, cliqueid);
  }

  freeslots.push_back(cliqueid);
  freespaces.emplace(len, start);

  cliques[cliqueid].start = -1;
  cliques[cliqueid].end = -1;
  numEntries -= len;
}